

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::~GeneratedCodeInfo_Annotation
          (GeneratedCodeInfo_Annotation *this)

{
  InternalMetadata *this_00;
  ulong uVar1;
  undefined8 *puVar2;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 == (undefined8 *)0x0) {
    if ((undefined8 *)(this->source_file_).tagged_ptr_.ptr_ !=
        &internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::DestroyNoArenaSlowPath(&this->source_file_);
      uVar1 = this_00->ptr_;
    }
    if ((uVar1 & 1) != 0) {
      internal::InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(this_00);
    }
  }
  RepeatedField<int>::~RepeatedField(&this->path_);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__MessageLite_004d46b0;
  internal::InternalMetadata::~InternalMetadata(this_00);
  return;
}

Assistant:

GeneratedCodeInfo_Annotation::~GeneratedCodeInfo_Annotation() {
  // @@protoc_insertion_point(destructor:google.protobuf.GeneratedCodeInfo.Annotation)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}